

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeanUpdater_impl.hpp
# Opt level: O3

void __thiscall
hiberlite::UpdateBean::
act<hiberlite::AVisitor<hiberlite::UpdateBean>,std::pair<int,std::vector<int,std::allocator<int>>>,hiberlite::stl_map_adapter<int,std::vector<int,std::allocator<int>>>>
          (UpdateBean *this,AVisitor<hiberlite::UpdateBean> *av,
          collection_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_hiberlite::stl_map_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
          *nvp)

{
  int *piVar1;
  pointer pcVar2;
  _Base_ptr p_Var3;
  sqlid_t rowid;
  RowScope *pRVar4;
  long index;
  _Self __tmp;
  _Base_ptr p_Var5;
  string tab;
  sql_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_> el_nvp;
  undefined1 *local_1b0;
  long local_1a8;
  undefined1 local_1a0 [16];
  shared_connection local_190;
  shared_connection local_180;
  undefined1 local_170 [32];
  pair<int,_std::vector<int,_std::allocator<int>_>_> *local_150;
  _Alloc_hider local_148;
  pair<int,_std::vector<int,_std::allocator<int>_>_> local_140;
  vector<int,_std::allocator<int>_> *local_120;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  undefined1 local_98 [40];
  _Alloc_hider local_70;
  char local_60 [16];
  string local_50;
  
  pcVar2 = (nvp->name)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + (nvp->name)._M_string_length);
  AVisitor<hiberlite::UpdateBean>::diveTable(av,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_170._0_8_ = local_170 + 0x10;
  pcVar2 = (av->scope)._table._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_170,pcVar2,pcVar2 + (av->scope)._table._M_string_length);
  pcVar2 = (av->scope)._prefix._M_dataplus._M_p;
  local_150 = &local_140;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,pcVar2,pcVar2 + (av->scope)._prefix._M_string_length);
  local_140.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_4_ = (av->scope).prefix_depth;
  local_1b0 = local_1a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b0,local_170._0_8_,(pointer)(local_170._0_8_ + local_170._8_8_));
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
    operator_delete((void *)local_170._0_8_);
  }
  p_Var5 = (nvp->stream).it._M_node;
  if ((_Rb_tree_header *)p_Var5 != &(((nvp->stream).ct)->_M_t)._M_impl.super__Rb_tree_header) {
    local_140.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = &(nvp->stream).xx.first;
    local_120 = &(nvp->stream).xx.second;
    index = 0;
    do {
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      (nvp->stream).it._M_node = p_Var3;
      (nvp->stream).xx.first = p_Var5[1]._M_color;
      std::vector<int,_std::allocator<int>_>::operator=
                (local_120,(vector<int,_std::allocator<int>_> *)&p_Var5[1]._M_parent);
      local_180._vptr_shared_res = (_func_int **)&PTR__shared_res_001d3578;
      local_180.res = (av->rootKey).con.res;
      if (local_180.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
        (local_180.res)->refCount = (local_180.res)->refCount + 1;
      }
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_1b0,local_1b0 + local_1a8)
      ;
      rowid = Database::allocId(&local_180,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      local_180._vptr_shared_res = (_func_int **)&PTR__shared_res_001d3578;
      if (local_180.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
        piVar1 = &(local_180.res)->refCount;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          (*(local_180.res)->_vptr_shared_cnt_obj_pair[1])();
        }
      }
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_f8,local_1b0,local_1b0 + local_1a8)
      ;
      pRVar4 = curRow(this);
      startRow(this,&local_f8,rowid,pRVar4->id,index);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"item","");
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
      sql_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>::sql_nvp
                ((sql_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_> *)local_170,
                 &local_118,
                 (pair<int,_std::vector<int,_std::allocator<int>_>_> *)
                 local_140.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      local_98._0_8_ = local_98 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,local_170._0_8_,(pointer)(local_170._0_8_ + local_170._8_8_));
      local_98._32_8_ = local_150;
      local_70._M_p = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_148._M_p,local_148._M_p + local_140._0_8_);
      AVisitor<hiberlite::UpdateBean>::operator&
                (av,(sql_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_> *)local_98);
      if (local_70._M_p != local_60) {
        operator_delete(local_70._M_p);
      }
      if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
        operator_delete((void *)local_98._0_8_);
      }
      local_190._vptr_shared_res = (_func_int **)&PTR__shared_res_001d3578;
      local_190.res = (av->rootKey).con.res;
      if (local_190.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
        (local_190.res)->refCount = (local_190.res)->refCount + 1;
      }
      commitRow(this,&local_190,rowid);
      local_190._vptr_shared_res = (_func_int **)&PTR__shared_res_001d3578;
      if (local_190.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
        piVar1 = &(local_190.res)->refCount;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          (*(local_190.res)->_vptr_shared_cnt_obj_pair[1])();
        }
      }
      if ((vector<int,_std::allocator<int>_> *)local_148._M_p != &local_140.second) {
        operator_delete(local_148._M_p);
      }
      if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
        operator_delete((void *)local_170._0_8_);
      }
      p_Var5 = (nvp->stream).it._M_node;
      index = index + 1;
    } while ((_Rb_tree_header *)p_Var5 != &(((nvp->stream).ct)->_M_t)._M_impl.super__Rb_tree_header)
    ;
  }
  AVisitor<hiberlite::UpdateBean>::popScope(av);
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0);
  }
  return;
}

Assistant:

void UpdateBean::act(AV& av, collection_nvp<E,S> nvp ){

	sqlid_t index=0;
	S& stream=nvp.stream;

	av.diveTable(nvp.name);
		std::string tab=av.getScope().table();
		while(!stream.done()){
			E& el=stream.getNext();
				sqlid_t entry_id=Database::allocId(av.getConnection(), tab);

				startRow(tab,entry_id, curRow()->id,index);
					sql_nvp<E> el_nvp("item",el);
					av & el_nvp;
				commitRow(av.getConnection(), entry_id);
			index++;
		}
	av.pop();
}